

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionIsAnAcceptor::RunImpl
          (TestsessionFixtureSessionIsAnAcceptor *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  sessionFixtureSessionIsAnAcceptorHelper fixtureHelper;
  bool ctorOk;
  TestsessionFixtureSessionIsAnAcceptor *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  sessionFixtureSessionIsAnAcceptorHelper::sessionFixtureSessionIsAnAcceptorHelper
            ((sessionFixtureSessionIsAnAcceptorHelper *)local_648,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionIsAnAcceptorHelper>
            ((sessionFixtureSessionIsAnAcceptorHelper *)local_648,&(this->super_Test).m_details);
  sessionFixtureSessionIsAnAcceptorHelper::~sessionFixtureSessionIsAnAcceptorHelper
            ((sessionFixtureSessionIsAnAcceptorHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionIsAnAcceptor) {
  createSession(0);
  CHECK(object->isAcceptor());
}